

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O0

uint64 __thiscall
libebml::EbmlUnicodeString::UpdateSize(EbmlUnicodeString *this,bool bWithDefault,bool param_2)

{
  uint uVar1;
  int iVar2;
  uint64 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool param_2_local;
  bool bWithDefault_local;
  EbmlUnicodeString *this_local;
  
  if ((bWithDefault) ||
     (uVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[0xf])(), (uVar1 & 1) == 0)) {
    UTFstring::GetUTF8_abi_cxx11_(&this->Value);
    uVar3 = std::__cxx11::string::length();
    EbmlElement::SetSize_(&this->super_EbmlElement,uVar3);
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    uVar3 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
    if (CONCAT44(extraout_var,iVar2) < uVar3) {
      uVar3 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
      EbmlElement::SetSize_(&this->super_EbmlElement,uVar3);
    }
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    this_local = (EbmlUnicodeString *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    this_local = (EbmlUnicodeString *)0x0;
  }
  return (uint64)this_local;
}

Assistant:

uint64 EbmlUnicodeString::UpdateSize(bool bWithDefault, bool /* bForceRender */)
{
  if (!bWithDefault && IsDefaultValue())
    return 0;

  SetSize_(Value.GetUTF8().length());
  if (GetSize() < GetDefaultSize())
    SetSize_(GetDefaultSize());

  return GetSize();
}